

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool hasLSTMWeightParamOfType(LSTMWeightParams *params,WeightParamType *type)

{
  bool bVar1;
  WeightParams *pWVar2;
  undefined1 local_19;
  WeightParamType *type_local;
  LSTMWeightParams *params_local;
  
  pWVar2 = CoreML::Specification::LSTMWeightParams::inputgateweightmatrix(params);
  bVar1 = isWeightParamOfType(pWVar2,type);
  local_19 = true;
  if (!bVar1) {
    pWVar2 = CoreML::Specification::LSTMWeightParams::forgetgateweightmatrix(params);
    bVar1 = isWeightParamOfType(pWVar2,type);
    local_19 = true;
    if (!bVar1) {
      pWVar2 = CoreML::Specification::LSTMWeightParams::blockinputweightmatrix(params);
      bVar1 = isWeightParamOfType(pWVar2,type);
      local_19 = true;
      if (!bVar1) {
        pWVar2 = CoreML::Specification::LSTMWeightParams::outputgateweightmatrix(params);
        bVar1 = isWeightParamOfType(pWVar2,type);
        local_19 = true;
        if (!bVar1) {
          pWVar2 = CoreML::Specification::LSTMWeightParams::inputgaterecursionmatrix(params);
          bVar1 = isWeightParamOfType(pWVar2,type);
          local_19 = true;
          if (!bVar1) {
            pWVar2 = CoreML::Specification::LSTMWeightParams::forgetgaterecursionmatrix(params);
            bVar1 = isWeightParamOfType(pWVar2,type);
            local_19 = true;
            if (!bVar1) {
              pWVar2 = CoreML::Specification::LSTMWeightParams::blockinputrecursionmatrix(params);
              bVar1 = isWeightParamOfType(pWVar2,type);
              local_19 = true;
              if (!bVar1) {
                pWVar2 = CoreML::Specification::LSTMWeightParams::outputgaterecursionmatrix(params);
                bVar1 = isWeightParamOfType(pWVar2,type);
                local_19 = true;
                if (!bVar1) {
                  pWVar2 = CoreML::Specification::LSTMWeightParams::inputgatebiasvector(params);
                  bVar1 = isWeightParamOfType(pWVar2,type);
                  local_19 = true;
                  if (!bVar1) {
                    pWVar2 = CoreML::Specification::LSTMWeightParams::forgetgatebiasvector(params);
                    bVar1 = isWeightParamOfType(pWVar2,type);
                    local_19 = true;
                    if (!bVar1) {
                      pWVar2 = CoreML::Specification::LSTMWeightParams::blockinputbiasvector(params)
                      ;
                      bVar1 = isWeightParamOfType(pWVar2,type);
                      local_19 = true;
                      if (!bVar1) {
                        pWVar2 = CoreML::Specification::LSTMWeightParams::outputgatebiasvector
                                           (params);
                        bVar1 = isWeightParamOfType(pWVar2,type);
                        local_19 = true;
                        if (!bVar1) {
                          pWVar2 = CoreML::Specification::LSTMWeightParams::inputgatepeepholevector
                                             (params);
                          bVar1 = isWeightParamOfType(pWVar2,type);
                          local_19 = true;
                          if (!bVar1) {
                            pWVar2 = CoreML::Specification::LSTMWeightParams::
                                     forgetgatepeepholevector(params);
                            bVar1 = isWeightParamOfType(pWVar2,type);
                            local_19 = true;
                            if (!bVar1) {
                              pWVar2 = CoreML::Specification::LSTMWeightParams::
                                       outputgatepeepholevector(params);
                              local_19 = isWeightParamOfType(pWVar2,type);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

static bool hasLSTMWeightParamOfType(const Specification::LSTMWeightParams& params,
                                               const WeightParamType& type) {

    return (isWeightParamOfType(params.inputgateweightmatrix(), type) ||
            isWeightParamOfType(params.forgetgateweightmatrix(), type) ||
            isWeightParamOfType(params.blockinputweightmatrix(), type) ||
            isWeightParamOfType(params.outputgateweightmatrix(), type) ||

            isWeightParamOfType(params.inputgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.forgetgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.blockinputrecursionmatrix(), type) ||
            isWeightParamOfType(params.outputgaterecursionmatrix(), type) ||

            isWeightParamOfType(params.inputgatebiasvector(), type) ||
            isWeightParamOfType(params.forgetgatebiasvector(), type) ||
            isWeightParamOfType(params.blockinputbiasvector(), type) ||
            isWeightParamOfType(params.outputgatebiasvector(), type) ||

            isWeightParamOfType(params.inputgatepeepholevector(), type) ||
            isWeightParamOfType(params.forgetgatepeepholevector(), type) ||
            isWeightParamOfType(params.outputgatepeepholevector(), type));
}